

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void dump_hex_script(envy_bios *bios,FILE *out,uint start,uint length)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  if (length != 0) {
    iVar2 = 0;
    do {
      uVar1 = 0x10;
      if (length < 0x10) {
        uVar1 = length;
      }
      if (iVar2 == 0) {
        fprintf((FILE *)out,"%04x:",(ulong)start);
      }
      else {
        fwrite("     ",5,1,(FILE *)out);
      }
      uVar5 = (ulong)(uVar1 + (uVar1 == 0));
      uVar3 = start;
      do {
        fprintf((FILE *)out," %02x",(ulong)bios->data[uVar3]);
        uVar3 = uVar3 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      uVar3 = length - uVar1;
      if (uVar3 == 0) {
        if (length < 0x10) {
          iVar4 = uVar1 - 0x10;
          do {
            fwrite("   ",3,1,(FILE *)out);
            iVar4 = iVar4 + 1;
          } while (iVar4 != 0);
        }
        fwrite("  ",2,1,(FILE *)out);
      }
      else {
        fputc(10,(FILE *)out);
      }
      start = start + uVar1;
      iVar2 = iVar2 + 1;
      length = uVar3;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void dump_hex_script (struct envy_bios *bios, FILE *out, unsigned int start, unsigned int length) {
	int cnt = 0;
	while (length) {
		unsigned int i, len = length;
		if (len > 16) len = 16;
		if (cnt)
			fprintf (out, "     ");
		else
			fprintf (out, "%04x:", start);
		for (i = 0; i < len; i++)
			fprintf(out, " %02x", bios->data[start+i]);
		start += len;
		length -= len;
		if (length) {
			fprintf(out, "\n");
		} else {
			while (len < 16) {
				fprintf(out, "   ");
				len++;
			}
			fprintf(out, "  ");
		}
		cnt++;
	}
}